

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression cnn::expr::zeroes(ComputationGraph *g,Dim *d)

{
  undefined8 extraout_RDX;
  Expression EVar1;
  
  ComputationGraph::add_function<cnn::Zeroes,cnn::Dim>
            ((ComputationGraph *)
             &(g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish,d);
  (g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)d;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = g;
  return EVar1;
}

Assistant:

Expression zeroes(ComputationGraph& g, const Dim& d) { return Expression(&g, g.add_function<Zeroes>(d)); }